

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O1

unique_ptr<obx::(anonymous_namespace)::QueryCondition,_std::default_delete<obx::(anonymous_namespace)::QueryCondition>_>
 __thiscall
obx::anon_unknown_3::QCString<(OBXPropertyType)9>::copyAsPtr(QCString<(OBXPropertyType)9> *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  
  pp_Var1 = (_func_int **)operator_new(0x38);
  *pp_Var1 = (_func_int *)&PTR__QueryCondition_001129b8;
  pp_Var1[1] = *(_func_int **)(in_RSI + 8);
  *pp_Var1 = (_func_int *)&PTR__QCString_00112890;
  pp_Var1[2] = (_func_int *)(pp_Var1 + 4);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pp_Var1 + 2),*(long *)(in_RSI + 0x10),
             *(long *)(in_RSI + 0x18) + *(long *)(in_RSI + 0x10));
  *(undefined1 *)(pp_Var1 + 6) = *(undefined1 *)(in_RSI + 0x30);
  (this->super_QC).super_QueryCondition._vptr_QueryCondition = pp_Var1;
  return (__uniq_ptr_data<obx::(anonymous_namespace)::QueryCondition,_std::default_delete<obx::(anonymous_namespace)::QueryCondition>,_true,_true>
          )(__uniq_ptr_data<obx::(anonymous_namespace)::QueryCondition,_std::default_delete<obx::(anonymous_namespace)::QueryCondition>,_true,_true>
            )this;
}

Assistant:

obx_qb_cond applyTo(OBX_query_builder* cqb, bool /*isRoot*/) const override {
        if (PropertyType == OBXPropertyType_String) {
            if (op_ == QueryOp::Equal) {
                return obx_qb_equals_string(cqb, propId_, value_.c_str(), caseSensitive_);
            } else if (op_ == QueryOp::NotEqual) {
                return obx_qb_not_equals_string(cqb, propId_, value_.c_str(), caseSensitive_);
            } else if (op_ == QueryOp::Less) {
                return obx_qb_less_than_string(cqb, propId_, value_.c_str(), caseSensitive_);
            } else if (op_ == QueryOp::LessOrEq) {
                return obx_qb_less_or_equal_string(cqb, propId_, value_.c_str(), caseSensitive_);
            } else if (op_ == QueryOp::Greater) {
                return obx_qb_greater_than_string(cqb, propId_, value_.c_str(), caseSensitive_);
            } else if (op_ == QueryOp::GreaterOrEq) {
                return obx_qb_greater_or_equal_string(cqb, propId_, value_.c_str(), caseSensitive_);
            } else if (op_ == QueryOp::StartsWith) {
                return obx_qb_starts_with_string(cqb, propId_, value_.c_str(), caseSensitive_);
            } else if (op_ == QueryOp::EndsWith) {
                return obx_qb_ends_with_string(cqb, propId_, value_.c_str(), caseSensitive_);
            } else if (op_ == QueryOp::Contains) {
                return obx_qb_contains_string(cqb, propId_, value_.c_str(), caseSensitive_);
            }
        } else if (PropertyType == OBXPropertyType_StringVector) {
            if (op_ == QueryOp::Contains) {
                return obx_qb_any_equals_string(cqb, propId_, value_.c_str(), caseSensitive_);
            }
        }
        throwInvalidOperation();
    }